

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

cram_block * cram_new_block(cram_content_type content_type,int content_id)

{
  cram_block *b;
  int content_id_local;
  cram_content_type content_type_local;
  
  _content_id_local = (cram_block *)malloc(0x40);
  if (_content_id_local == (cram_block *)0x0) {
    _content_id_local = (cram_block *)0x0;
  }
  else {
    _content_id_local->orig_method = RAW;
    _content_id_local->method = RAW;
    _content_id_local->content_type = content_type;
    _content_id_local->content_id = content_id;
    _content_id_local->comp_size = 0;
    _content_id_local->uncomp_size = 0;
    _content_id_local->data = (uchar *)0x0;
    _content_id_local->alloc = 0;
    _content_id_local->byte = 0;
    _content_id_local->bit = 7;
  }
  return _content_id_local;
}

Assistant:

cram_block *cram_new_block(enum cram_content_type content_type,
			   int content_id) {
    cram_block *b = malloc(sizeof(*b));
    if (!b)
	return NULL;
    b->method = b->orig_method = RAW;
    b->content_type = content_type;
    b->content_id = content_id;
    b->comp_size = 0;
    b->uncomp_size = 0;
    b->data = NULL;
    b->alloc = 0;
    b->byte = 0;
    b->bit = 7; // MSB

    return b;
}